

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkShareXor(Abc_Ntk_t *pNtk,int nMultiSize,int fAnd,int fVerbose)

{
  int iVar1;
  Abc_ShaMan_t *p_00;
  Abc_ShaMan_t *p;
  Abc_Ntk_t *pNtkNew;
  int fVerbose_local;
  int fAnd_local;
  int nMultiSize_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 != 0) {
    p_00 = Abc_ShaManStart(pNtk);
    p_00->nMultiSize = nMultiSize;
    p_00->fVerbose = fVerbose;
    Abc_NtkTraverseSupers(p_00,fAnd);
    if (p_00->nStartCols < 2) {
      Abc_ShaManStop(p_00);
      pNtk_local = Abc_NtkDup(pNtk);
    }
    else {
      if (fVerbose != 0) {
        Abc_NtkSharePrint(p_00);
      }
      Abc_NtkShareOptimize(p_00,fAnd);
      if (fVerbose != 0) {
        Abc_NtkSharePrint(p_00);
      }
      pNtk_local = Abc_NtkUpdateNetwork(p_00,fAnd);
      Abc_ShaManStop(p_00);
    }
    return pNtk_local;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                ,0x2d4,"Abc_Ntk_t *Abc_NtkShareXor(Abc_Ntk_t *, int, int, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkShareXor( Abc_Ntk_t * pNtk, int nMultiSize, int fAnd, int fVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Abc_ShaMan_t * p;
    assert( Abc_NtkIsStrash(pNtk) );
//    Abc_NtkDumpBlif( pNtk );
    p = Abc_ShaManStart( pNtk );
    p->nMultiSize = nMultiSize;
    p->fVerbose   = fVerbose;
    Abc_NtkTraverseSupers( p, fAnd );
    if ( p->nStartCols < 2 )
    {
        Abc_ShaManStop( p );
        return Abc_NtkDup( pNtk );
    }
    if ( fVerbose )
        Abc_NtkSharePrint( p );
    Abc_NtkShareOptimize( p, fAnd );
    if ( fVerbose )
        Abc_NtkSharePrint( p );
    pNtkNew = Abc_NtkUpdateNetwork( p, fAnd );
    Abc_ShaManStop( p );
    return pNtkNew;
}